

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlregexp.c
# Opt level: O2

void xmlRegexpErrCompile(xmlRegParserCtxtPtr ctxt,char *extra)

{
  int iVar1;
  
  ctxt->error = 0x5aa;
  iVar1 = xmlRaiseError((xmlStructuredErrorFunc)0x0,(xmlGenericErrorFunc)0x0,(void *)0x0,(void *)0x0
                        ,(xmlNode *)0x0,0xe,0x5aa,XML_ERR_FATAL,(char *)0x0,0,extra,
                        (char *)ctxt->string,(char *)0x0,*(int *)&ctxt->cur - (int)ctxt->string,0,
                        "failed to compile: %s\n",extra);
  if (-1 < iVar1) {
    return;
  }
  xmlRegexpErrMemory(ctxt);
  return;
}

Assistant:

static void
xmlRegexpErrCompile(xmlRegParserCtxtPtr ctxt, const char *extra)
{
    const char *regexp = NULL;
    int idx = 0;
    int res;

    if (ctxt != NULL) {
        regexp = (const char *) ctxt->string;
	idx = ctxt->cur - ctxt->string;
	ctxt->error = XML_REGEXP_COMPILE_ERROR;
    }

    res = xmlRaiseError(NULL, NULL, NULL, NULL, NULL, XML_FROM_REGEXP,
                        XML_REGEXP_COMPILE_ERROR, XML_ERR_FATAL,
                        NULL, 0, extra, regexp, NULL, idx, 0,
                        "failed to compile: %s\n", extra);
    if (res < 0)
        xmlRegexpErrMemory(ctxt);
}